

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O1

int lj_cf_os_exit(lua_State *L)

{
  uint32_t uVar1;
  uint __status;
  
  if ((L->base < L->top) && (uVar1 = (L->base->field_2).it, uVar1 + 3 < 2)) {
    __status = (uint)(uVar1 == 0xfffffffe);
  }
  else {
    __status = lj_lib_optint(L,1,0);
  }
  if ((L->base + 1 < L->top) && (*(uint *)((long)L->base + 0xc) < 0xfffffffe)) {
    lua_close(L);
  }
  exit(__status);
}

Assistant:

LJLIB_CF(os_exit)
{
  int status;
  if (L->base < L->top && tvisbool(L->base))
    status = boolV(L->base) ? EXIT_SUCCESS : EXIT_FAILURE;
  else
    status = lj_lib_optint(L, 1, EXIT_SUCCESS);
  if (L->base+1 < L->top && tvistruecond(L->base+1))
    lua_close(L);
  exit(status);
  return 0;  /* Unreachable. */
}